

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_Proto2Features_Test::TestBody
          (FeaturesTest_Proto2Features_Test *this)

{
  Descriptor *this_00;
  uint uVar1;
  bool bVar2;
  Utf8CheckMode UVar3;
  CppStringType CVar4;
  FileDescriptor *descriptor;
  MessageLite *pMVar5;
  FieldDescriptor *pFVar6;
  FieldDescriptor *pFVar7;
  Nonnull<const_char_*> pcVar8;
  char *in_R9;
  pointer *__ptr;
  pointer *__ptr_2;
  char *pcVar9;
  pointer *__ptr_4;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  Metadata MVar10;
  AssertionResult gtest_ar_2;
  string file_textproto;
  FileDescriptorProto proto;
  AssertionResult gtest_ar_10;
  FileDescriptorProto file_proto;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  undefined8 local_2c0;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined1 local_2b0 [32];
  AssertHelper local_290 [2];
  undefined1 local_280 [16];
  undefined1 local_270 [8];
  _Alloc_hider local_268;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 local_260;
  char local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  long local_160;
  uint local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  long local_140;
  long local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  FileDescriptorProto local_128;
  
  local_270 = (undefined1  [8])0x46f;
  local_268._M_p =
       "\n    name: \"foo.proto\"\n    message_type {\n      name: \"Foo\"\n      field { name: \"bar\" number: 1 label: LABEL_OPTIONAL type: TYPE_INT64 }\n      field {\n        name: \"group\"\n        number: 2\n        label: LABEL_OPTIONAL\n        type: TYPE_GROUP\n        type_name: \".Foo\"\n      }\n      field { name: \"str\" number: 3 label: LABEL_OPTIONAL type: TYPE_STRING }\n      field { name: \"rep\" number: 4 label: LABEL_REPEATED type: TYPE_INT32 }\n      field {\n        name: \"packed\"\n        number: 5\n        label: LABEL_REPEATED\n        type: TYPE_INT64\n        options { packed: true }\n      }\n      field { name: \"utf8\" number: 6 label: LABEL_REPEATED type: TYPE_STRING }\n      field { name: \"req\" number: 7 label: LABEL_REQUIRED type: TYPE_INT32 }\n      field {\n        name: \"cord\"\n        number: 8\n        label: LABEL_OPTIONAL\n        type: TYPE_BYTES\n        options { ctype: CORD }\n      }\n      field {\n        name: \"piece\"\n        number: 9\n        label: LABEL_OPTIONAL\n        type: TYPE_STRING\n        options { ctype: STRING_PIECE }\n      }\n    }\n    enum_type {\n      name: \"Foo2\"\n      value { name: \"BAR\" number: 1 }\n    }\n  "
  ;
  ParseTextOrDie::operator_cast_to_FileDescriptorProto(&local_128,(ParseTextOrDie *)local_270);
  MVar10 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar10.descriptor)->file_);
  MVar10 = pb::CppFeatures::GetMetadata((CppFeatures *)pb::_CppFeatures_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar10.descriptor)->file_);
  descriptor = DescriptorPool::BuildFile
                         (&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_,&local_128);
  if (descriptor == (FileDescriptor *)0x0) {
    absl::lts_20250127::log_internal::DieBecauseNull
              ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x203c,"pool_.BuildFile(file_proto)");
  }
  if ((long)descriptor->message_type_count_ < 1) {
    pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)descriptor->message_type_count_,"index < message_type_count()");
  }
  else {
    pcVar8 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar8 == (Nonnull<const_char_*>)0x0) {
    this_00 = descriptor->message_types_;
    if ((long)this_00->field_count_ < 1) {
      pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)this_00->field_count_,"index < field_count()");
    }
    else {
      pcVar8 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar8 == (Nonnull<const_char_*>)0x0) {
      pFVar7 = this_00->fields_;
      if ((long)this_00->field_count_ < 2) {
        pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (1,(long)this_00->field_count_,"index < field_count()");
      }
      else {
        pcVar8 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar8 == (Nonnull<const_char_*>)0x0) {
        pFVar6 = this_00->fields_;
        pcVar9 = anon_var_dwarf_a12c75 + 5;
        local_2d0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (anon_var_dwarf_a12c75 + 5);
        testing::internal::
        PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::
        operator()(local_270,(char *)&local_2d0,(FileOptions *)0x10e6621);
        if (local_270[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_2d0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = *(char **)local_268._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2040,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_2b0,(Message *)&local_2d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
          if (local_2d0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_2d0._M_head_impl + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_268._M_p);
        }
        pMVar5 = protobuf::internal::ExtensionSet::GetMessage
                           (&(descriptor->merged_features_->field_0)._impl_._extensions_,pb::test,
                            (MessageLite *)PTR__TestFeatures_default_instance__019cf370);
        local_2d0._M_head_impl._0_4_ = (int)pMVar5[1]._internal_metadata_.ptr_;
        local_2b0._0_4_ = 1;
        testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
                  ((internal *)local_270,"GetFeatures(file).GetExtension(pb::test).file_feature()",
                   "pb::VALUE1",(EnumFeature *)&local_2d0,(EnumFeature *)local_2b0);
        if (local_270[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_2d0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar9 = *(char **)local_268._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2042,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_2b0,(Message *)&local_2d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
          if (local_2d0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_2d0._M_head_impl + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_268._M_p);
        }
        local_2b0._0_8_ =
             "\n                field_presence: EXPLICIT\n                enum_type: CLOSED\n                repeated_field_encoding: EXPANDED\n                utf8_validation: NONE\n                message_encoding: LENGTH_PREFIXED\n                json_format: LEGACY_BEST_EFFORT\n                enforce_naming_style: STYLE_LEGACY\n                default_symbol_visibility: EXPORT_ALL\n                [pb.cpp] {\n                  legacy_closed_enum: true\n                  string_type: STRING\n                  enum_name_uses_string_view: false\n                }"
        ;
        GetCoreFeatures<google::protobuf::FileDescriptor>((FeatureSet *)local_270,descriptor);
        testing::internal::
        PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::
        operator()(&local_2d0,local_2b0,(FeatureSet *)"GetCoreFeatures(file)");
        FeatureSet::~FeatureSet((FeatureSet *)local_270);
        if (local_2d0._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_270);
          if (local_2c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar9 = (local_2c8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2050,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_2b0,(Message *)local_270)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
          if (local_270 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_270 + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        local_2b0._0_8_ =
             "\n                field_presence: EXPLICIT\n                enum_type: CLOSED\n                repeated_field_encoding: EXPANDED\n                utf8_validation: NONE\n                message_encoding: LENGTH_PREFIXED\n                json_format: LEGACY_BEST_EFFORT\n                enforce_naming_style: STYLE_LEGACY\n                default_symbol_visibility: EXPORT_ALL\n                [pb.cpp] {\n                  legacy_closed_enum: true\n                  string_type: STRING\n                  enum_name_uses_string_view: false\n                }"
        ;
        GetCoreFeatures<google::protobuf::FieldDescriptor>((FeatureSet *)local_270,pFVar7);
        testing::internal::
        PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::
        operator()(&local_2d0,local_2b0,(FeatureSet *)"GetCoreFeatures(field)");
        FeatureSet::~FeatureSet((FeatureSet *)local_270);
        if (local_2d0._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_270);
          if (local_2c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar9 = (local_2c8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x205e,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_2b0,(Message *)local_270)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
          if (local_270 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_270 + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        local_2b0._0_8_ =
             "\n                field_presence: EXPLICIT\n                enum_type: CLOSED\n                repeated_field_encoding: EXPANDED\n                utf8_validation: NONE\n                message_encoding: DELIMITED\n                json_format: LEGACY_BEST_EFFORT\n                enforce_naming_style: STYLE_LEGACY\n                default_symbol_visibility: EXPORT_ALL\n                [pb.cpp] {\n                  legacy_closed_enum: true\n                  string_type: STRING\n                  enum_name_uses_string_view: false\n                }"
        ;
        GetCoreFeatures<google::protobuf::FieldDescriptor>((FeatureSet *)local_270,pFVar6 + 1);
        testing::internal::
        PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::
        operator()(&local_2d0,local_2b0,(FeatureSet *)"GetCoreFeatures(group)");
        FeatureSet::~FeatureSet((FeatureSet *)local_270);
        if (local_2d0._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_270);
          if (local_2c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar9 = (local_2c8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x206c,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_2b0,(Message *)local_270)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
          if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )local_270 !=
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0) {
            (**(code **)(*(long *)local_270 + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        bVar2 = FieldDescriptor::has_presence(pFVar7);
        local_2d0._M_head_impl._0_1_ = (internal)bVar2;
        local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar2) {
          testing::Message::Message((Message *)local_2b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_270,(internal *)&local_2d0,(AssertionResult *)0x143283f,"false"
                     ,"true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x206d,(char *)local_270);
          testing::internal::AssertHelper::operator=(local_290,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(local_290);
          if (local_270 != (undefined1  [8])&local_260) {
            operator_delete((void *)local_270,(ulong)(local_260._0_8_ + 1));
          }
          if ((AssertHelperData *)local_2b0._0_8_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_2b0._0_8_ + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        bVar2 = FieldDescriptor::requires_utf8_validation(pFVar7);
        local_2d0._M_head_impl._0_1_ = (internal)!bVar2;
        local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)local_2b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_270,(internal *)&local_2d0,(AssertionResult *)0x10ec8cd,"true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x206e,(char *)local_270);
          testing::internal::AssertHelper::operator=(local_290,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(local_290);
          if (local_270 != (undefined1  [8])&local_260) {
            operator_delete((void *)local_270,(ulong)(local_260._0_8_ + 1));
          }
          if ((AssertHelperData *)local_2b0._0_8_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_2b0._0_8_ + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        name._M_str = "str";
        name._M_len = 3;
        pFVar6 = Descriptor::FindFieldByName(this_00,name);
        UVar3 = protobuf::internal::cpp::GetUtf8CheckMode(pFVar6,false);
        local_2d0._M_head_impl._0_1_ = (internal)UVar3;
        local_2b0[0] = 1;
        testing::internal::
        CmpHelperEQ<google::protobuf::internal::cpp::Utf8CheckMode,google::protobuf::internal::cpp::Utf8CheckMode>
                  ((internal *)local_270,
                   "GetUtf8CheckMode(message->FindFieldByName(\"str\"), false)",
                   "Utf8CheckMode::kVerify",(Utf8CheckMode *)&local_2d0,local_2b0);
        if (local_270[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_2d0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar9 = *(char **)local_268._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2071,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_2b0,(Message *)&local_2d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
          if (local_2d0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_2d0._M_head_impl + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_268._M_p);
        }
        name_00._M_str = "str";
        name_00._M_len = 3;
        pFVar6 = Descriptor::FindFieldByName(this_00,name_00);
        UVar3 = protobuf::internal::cpp::GetUtf8CheckMode(pFVar6,true);
        local_2d0._M_head_impl._0_1_ = (internal)UVar3;
        local_2b0[0] = 2;
        testing::internal::
        CmpHelperEQ<google::protobuf::internal::cpp::Utf8CheckMode,google::protobuf::internal::cpp::Utf8CheckMode>
                  ((internal *)local_270,"GetUtf8CheckMode(message->FindFieldByName(\"str\"), true)"
                   ,"Utf8CheckMode::kNone",(Utf8CheckMode *)&local_2d0,local_2b0);
        if (local_270[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_2d0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar9 = *(char **)local_268._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2073,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_2b0,(Message *)&local_2d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
          if (local_2d0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_2d0._M_head_impl + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_268._M_p);
        }
        name_01._M_str = "cord";
        name_01._M_len = 4;
        pFVar6 = Descriptor::FindFieldByName(this_00,name_01);
        GetCoreFeatures<google::protobuf::FieldDescriptor>((FeatureSet *)local_270,pFVar6);
        pMVar5 = protobuf::internal::ExtensionSet::GetMessage
                           ((ExtensionSet *)&local_260,pb::cpp,
                            (MessageLite *)PTR__CppFeatures_default_instance__019e91e0);
        local_2b0._0_4_ = (int)pMVar5[1]._internal_metadata_.ptr_;
        testing::internal::CmpHelperEQ<pb::CppFeatures_StringType,pb::CppFeatures_StringType>
                  ((internal *)&local_2d0,
                   "GetCoreFeatures(message->FindFieldByName(\"cord\")) .GetExtension(pb::cpp) .string_type()"
                   ,"pb::CppFeatures::CORD",(CppFeatures_StringType *)local_2b0,
                   &pb::CppFeatures::CORD);
        FeatureSet::~FeatureSet((FeatureSet *)local_270);
        if (local_2d0._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_270);
          if (local_2c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar9 = (local_2c8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2077,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_2b0,(Message *)local_270)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
          if (local_270 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_270 + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        bVar2 = FieldDescriptor::is_packed(pFVar7);
        local_2d0._M_head_impl._0_1_ = (internal)!bVar2;
        local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)local_2b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_270,(internal *)&local_2d0,(AssertionResult *)0x10eca00,"true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2078,(char *)local_270);
          testing::internal::AssertHelper::operator=(local_290,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(local_290);
          if (local_270 != (undefined1  [8])&local_260) {
            operator_delete((void *)local_270,(ulong)(local_260._0_8_ + 1));
          }
          if ((AssertHelperData *)local_2b0._0_8_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_2b0._0_8_ + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        bVar2 = FieldDescriptor::legacy_enum_field_treated_as_closed(pFVar7);
        local_2d0._M_head_impl._0_1_ = (internal)!bVar2;
        local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)local_2b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_270,(internal *)&local_2d0,
                     (AssertionResult *)"field->legacy_enum_field_treated_as_closed()","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2079,(char *)local_270);
          testing::internal::AssertHelper::operator=(local_290,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(local_290);
          if (local_270 != (undefined1  [8])&local_260) {
            operator_delete((void *)local_270,(ulong)(local_260._0_8_ + 1));
          }
          if ((AssertHelperData *)local_2b0._0_8_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_2b0._0_8_ + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        bVar2 = protobuf::internal::cpp::HasPreservingUnknownEnumSemantics(pFVar7);
        local_2d0._M_head_impl._0_1_ = (internal)!bVar2;
        local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)local_2b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_270,(internal *)&local_2d0,
                     (AssertionResult *)"HasPreservingUnknownEnumSemantics(field)","true","false",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x207a,(char *)local_270);
          testing::internal::AssertHelper::operator=(local_290,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(local_290);
          if (local_270 != (undefined1  [8])&local_260) {
            operator_delete((void *)local_270,(ulong)(local_260._0_8_ + 1));
          }
          if ((AssertHelperData *)local_2b0._0_8_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_2b0._0_8_ + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        name_02._M_str = "str";
        name_02._M_len = 3;
        pFVar7 = Descriptor::FindFieldByName(this_00,name_02);
        bVar2 = FieldDescriptor::requires_utf8_validation(pFVar7);
        local_2d0._M_head_impl._0_1_ = (internal)!bVar2;
        local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)local_2b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_270,(internal *)&local_2d0,
                     (AssertionResult *)
                     "message->FindFieldByName(\"str\")->requires_utf8_validation()","true","false",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x207b,(char *)local_270);
          testing::internal::AssertHelper::operator=(local_290,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(local_290);
          if (local_270 != (undefined1  [8])&local_260) {
            operator_delete((void *)local_270,(ulong)(local_260._0_8_ + 1));
          }
          if ((AssertHelperData *)local_2b0._0_8_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_2b0._0_8_ + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        name_03._M_str = "rep";
        name_03._M_len = 3;
        pFVar7 = Descriptor::FindFieldByName(this_00,name_03);
        bVar2 = FieldDescriptor::is_packed(pFVar7);
        local_2d0._M_head_impl._0_1_ = (internal)!bVar2;
        local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)local_2b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_270,(internal *)&local_2d0,
                     (AssertionResult *)"message->FindFieldByName(\"rep\")->is_packed()","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x207c,(char *)local_270);
          testing::internal::AssertHelper::operator=(local_290,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(local_290);
          if (local_270 != (undefined1  [8])&local_260) {
            operator_delete((void *)local_270,(ulong)(local_260._0_8_ + 1));
          }
          if ((AssertHelperData *)local_2b0._0_8_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_2b0._0_8_ + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        name_04._M_str = "utf8";
        name_04._M_len = 4;
        pFVar7 = Descriptor::FindFieldByName(this_00,name_04);
        bVar2 = FieldDescriptor::requires_utf8_validation(pFVar7);
        local_2d0._M_head_impl._0_1_ = (internal)!bVar2;
        local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)local_2b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_270,(internal *)&local_2d0,
                     (AssertionResult *)
                     "message->FindFieldByName(\"utf8\")->requires_utf8_validation()","true","false"
                     ,in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x207d,(char *)local_270);
          testing::internal::AssertHelper::operator=(local_290,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(local_290);
          if (local_270 != (undefined1  [8])&local_260) {
            operator_delete((void *)local_270,(ulong)(local_260._0_8_ + 1));
          }
          if ((AssertHelperData *)local_2b0._0_8_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_2b0._0_8_ + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        name_05._M_str = "packed";
        name_05._M_len = 6;
        pFVar7 = Descriptor::FindFieldByName(this_00,name_05);
        bVar2 = FieldDescriptor::is_packed(pFVar7);
        local_2d0._M_head_impl._0_1_ = (internal)bVar2;
        local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar2) {
          testing::Message::Message((Message *)local_2b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_270,(internal *)&local_2d0,
                     (AssertionResult *)"message->FindFieldByName(\"packed\")->is_packed()","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x207e,(char *)local_270);
          testing::internal::AssertHelper::operator=(local_290,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(local_290);
          if (local_270 != (undefined1  [8])&local_260) {
            operator_delete((void *)local_270,(ulong)(local_260._0_8_ + 1));
          }
          if ((AssertHelperData *)local_2b0._0_8_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_2b0._0_8_ + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        name_06._M_str = "req";
        name_06._M_len = 3;
        pFVar7 = Descriptor::FindFieldByName(this_00,name_06);
        bVar2 = FieldDescriptor::is_required(pFVar7);
        local_2d0._M_head_impl._0_1_ = (internal)bVar2;
        local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar2) {
          testing::Message::Message((Message *)local_2b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_270,(internal *)&local_2d0,
                     (AssertionResult *)"message->FindFieldByName(\"req\")->is_required()","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x207f,(char *)local_270);
          testing::internal::AssertHelper::operator=(local_290,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(local_290);
          if (local_270 != (undefined1  [8])&local_260) {
            operator_delete((void *)local_270,(ulong)(local_260._0_8_ + 1));
          }
          if ((AssertHelperData *)local_2b0._0_8_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_2b0._0_8_ + 8))();
          }
        }
        if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2c8,local_2c8);
        }
        if ((long)descriptor->enum_type_count_ < 1) {
          pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (0,(long)descriptor->enum_type_count_,"index < enum_type_count()");
        }
        else {
          pcVar8 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar8 == (Nonnull<const_char_*>)0x0) {
          bVar2 = EnumDescriptor::is_closed(descriptor->enum_types_);
          local_2d0._M_head_impl._0_1_ = (internal)bVar2;
          local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!bVar2) {
            testing::Message::Message((Message *)local_2b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_270,(internal *)&local_2d0,
                       (AssertionResult *)"file->enum_type(0)->is_closed()","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (local_290,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x2080,(char *)local_270);
            testing::internal::AssertHelper::operator=(local_290,(Message *)local_2b0);
            testing::internal::AssertHelper::~AssertHelper(local_290);
            if (local_270 != (undefined1  [8])&local_260) {
              operator_delete((void *)local_270,(ulong)(local_260._0_8_ + 1));
            }
            if ((AssertHelperData *)local_2b0._0_8_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_2b0._0_8_ + 8))();
            }
          }
          if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_2c8,local_2c8);
          }
          name_07._M_str = "str";
          name_07._M_len = 3;
          pFVar7 = Descriptor::FindFieldByName(this_00,name_07);
          CVar4 = FieldDescriptor::cpp_string_type(pFVar7);
          local_2d0._M_head_impl._0_4_ = CVar4;
          local_2b0._0_4_ = 3;
          testing::internal::
          CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::CppStringType,google::protobuf::internal::FieldDescriptorLite::CppStringType>
                    ((internal *)local_270,"message->FindFieldByName(\"str\")->cpp_string_type()",
                     "FieldDescriptor::CppStringType::kString",(CppStringType *)&local_2d0,
                     (CppStringType *)local_2b0);
          if (local_270[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_2d0);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar9 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar9 = *(char **)local_268._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_2b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x2083,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_2b0,(Message *)&local_2d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
            if (local_2d0._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_2d0._M_head_impl + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_268,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_268._M_p);
          }
          name_08._M_str = "cord";
          name_08._M_len = 4;
          pFVar7 = Descriptor::FindFieldByName(this_00,name_08);
          CVar4 = FieldDescriptor::cpp_string_type(pFVar7);
          local_2d0._M_head_impl._0_4_ = CVar4;
          local_2b0._0_4_ = 2;
          testing::internal::
          CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::CppStringType,google::protobuf::internal::FieldDescriptorLite::CppStringType>
                    ((internal *)local_270,"message->FindFieldByName(\"cord\")->cpp_string_type()",
                     "FieldDescriptor::CppStringType::kCord",(CppStringType *)&local_2d0,
                     (CppStringType *)local_2b0);
          if (local_270[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_2d0);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar9 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar9 = *(char **)local_268._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_2b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x2085,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_2b0,(Message *)&local_2d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
            if (local_2d0._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_2d0._M_head_impl + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_268,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_268._M_p);
          }
          FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_270,(Arena *)0x0);
          FileDescriptor::CopyTo(descriptor,(FileDescriptorProto *)local_270);
          local_2b0._8_8_ = 0;
          local_2b0[0x10] = '\0';
          local_2b0._0_8_ = (AssertHelperData *)(local_2b0 + 0x10);
          TextFormat::PrintToString(&local_128.super_Message,(string *)local_2b0);
          local_168 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_158;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,local_2b0._0_8_,
                     (pointer)(local_2b0._0_8_ + local_2b0._8_8_));
          uVar1 = local_158;
          local_140 = local_160;
          if (local_168 ==
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158)
          {
            uStack_2b8 = uStack_150;
            uStack_2b4 = uStack_14c;
            local_2d0._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_2c0;
          }
          else {
            local_2d0._M_head_impl = local_168;
          }
          local_2c0 = CONCAT44(uStack_154,local_158);
          local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160
          ;
          local_160 = 0;
          local_158 = local_158 & 0xffffff00;
          if (local_2d0._M_head_impl ==
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c0)
          {
            local_138 = CONCAT44(uStack_154,uVar1);
            uStack_130 = uStack_2b8;
            uStack_12c = uStack_2b4;
            local_148 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_138;
          }
          else {
            local_148 = local_2d0._M_head_impl;
            local_138 = local_2c0;
          }
          local_2d0._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c0
          ;
          local_168 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_158;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,local_148,local_148 + local_140);
          local_290[0].data_ = (AssertHelperData *)local_280;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_290,local_2d0._M_head_impl,
                     local_2d0._M_head_impl + (long)local_2c8);
          if (local_2d0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c0)
          {
            operator_delete(local_2d0._M_head_impl,local_2c0 + 1);
          }
          testing::internal::
          PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<std::__cxx11::string>>
          ::operator()(local_178,(char *)local_290,(FileDescriptorProto *)0x13edf73);
          if (local_290[0].data_ != (AssertHelperData *)local_280) {
            operator_delete(local_290[0].data_,local_280._0_8_ + 1);
          }
          if (local_148 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138)
          {
            operator_delete(local_148,local_138 + 1);
          }
          if (local_168 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158)
          {
            operator_delete(local_168,CONCAT44(uStack_154,local_158) + 1);
          }
          if (local_178[0] == '\0') {
            testing::Message::Message((Message *)&local_2d0);
            if (local_170 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar9 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar9 = (local_170->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (local_290,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x208c,pcVar9);
            testing::internal::AssertHelper::operator=(local_290,(Message *)&local_2d0);
            testing::internal::AssertHelper::~AssertHelper(local_290);
            if (local_2d0._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_2d0._M_head_impl + 8))();
            }
          }
          if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_170,local_170);
          }
          if ((AssertHelperData *)local_2b0._0_8_ != (AssertHelperData *)(local_2b0 + 0x10)) {
            operator_delete((void *)local_2b0._0_8_,CONCAT71(local_2b0._17_7_,local_2b0[0x10]) + 1);
          }
          FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_270);
          FileDescriptorProto::~FileDescriptorProto(&local_128);
          return;
        }
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_270,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xae8,pcVar8);
      }
      else {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_270,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar8);
      }
    }
    else {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_270,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xa88,pcVar8);
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xae7,pcVar8);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_270);
}

Assistant:

TEST_F(FeaturesTest, Proto2Features) {
  FileDescriptorProto file_proto = ParseTextOrDie(R"pb(
    name: "foo.proto"
    message_type {
      name: "Foo"
      field { name: "bar" number: 1 label: LABEL_OPTIONAL type: TYPE_INT64 }
      field {
        name: "group"
        number: 2
        label: LABEL_OPTIONAL
        type: TYPE_GROUP
        type_name: ".Foo"
      }
      field { name: "str" number: 3 label: LABEL_OPTIONAL type: TYPE_STRING }
      field { name: "rep" number: 4 label: LABEL_REPEATED type: TYPE_INT32 }
      field {
        name: "packed"
        number: 5
        label: LABEL_REPEATED
        type: TYPE_INT64
        options { packed: true }
      }
      field { name: "utf8" number: 6 label: LABEL_REPEATED type: TYPE_STRING }
      field { name: "req" number: 7 label: LABEL_REQUIRED type: TYPE_INT32 }
      field {
        name: "cord"
        number: 8
        label: LABEL_OPTIONAL
        type: TYPE_BYTES
        options { ctype: CORD }
      }
      field {
        name: "piece"
        number: 9
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options { ctype: STRING_PIECE }
      }
    }
    enum_type {
      name: "Foo2"
      value { name: "BAR" number: 1 }
    }
  )pb");

  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::CppFeatures::GetDescriptor()->file());
  const FileDescriptor* file = ABSL_DIE_IF_NULL(pool_.BuildFile(file_proto));
  const Descriptor* message = file->message_type(0);
  const FieldDescriptor* field = message->field(0);
  const FieldDescriptor* group = message->field(1);
  EXPECT_THAT(file->options(), EqualsProto(""));
  EXPECT_EQ(GetFeatures(file).GetExtension(pb::test).file_feature(),
            pb::VALUE1);
  EXPECT_THAT(GetCoreFeatures(file), EqualsProto(R"pb(
                field_presence: EXPLICIT
                enum_type: CLOSED
                repeated_field_encoding: EXPANDED
                utf8_validation: NONE
                message_encoding: LENGTH_PREFIXED
                json_format: LEGACY_BEST_EFFORT
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
                [pb.cpp] {
                  legacy_closed_enum: true
                  string_type: STRING
                  enum_name_uses_string_view: false
                })pb"));
  EXPECT_THAT(GetCoreFeatures(field), EqualsProto(R"pb(
                field_presence: EXPLICIT
                enum_type: CLOSED
                repeated_field_encoding: EXPANDED
                utf8_validation: NONE
                message_encoding: LENGTH_PREFIXED
                json_format: LEGACY_BEST_EFFORT
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
                [pb.cpp] {
                  legacy_closed_enum: true
                  string_type: STRING
                  enum_name_uses_string_view: false
                })pb"));
  EXPECT_THAT(GetCoreFeatures(group), EqualsProto(R"pb(
                field_presence: EXPLICIT
                enum_type: CLOSED
                repeated_field_encoding: EXPANDED
                utf8_validation: NONE
                message_encoding: DELIMITED
                json_format: LEGACY_BEST_EFFORT
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
                [pb.cpp] {
                  legacy_closed_enum: true
                  string_type: STRING
                  enum_name_uses_string_view: false
                })pb"));
  EXPECT_TRUE(field->has_presence());
  EXPECT_FALSE(field->requires_utf8_validation());
  EXPECT_EQ(
      GetUtf8CheckMode(message->FindFieldByName("str"), /*is_lite=*/false),
      Utf8CheckMode::kVerify);
  EXPECT_EQ(GetUtf8CheckMode(message->FindFieldByName("str"), /*is_lite=*/true),
            Utf8CheckMode::kNone);
  EXPECT_EQ(GetCoreFeatures(message->FindFieldByName("cord"))
                .GetExtension(pb::cpp)
                .string_type(),
            pb::CppFeatures::CORD);
  EXPECT_FALSE(field->is_packed());
  EXPECT_FALSE(field->legacy_enum_field_treated_as_closed());
  EXPECT_FALSE(HasPreservingUnknownEnumSemantics(field));
  EXPECT_FALSE(message->FindFieldByName("str")->requires_utf8_validation());
  EXPECT_FALSE(message->FindFieldByName("rep")->is_packed());
  EXPECT_FALSE(message->FindFieldByName("utf8")->requires_utf8_validation());
  EXPECT_TRUE(message->FindFieldByName("packed")->is_packed());
  EXPECT_TRUE(message->FindFieldByName("req")->is_required());
  EXPECT_TRUE(file->enum_type(0)->is_closed());

  EXPECT_EQ(message->FindFieldByName("str")->cpp_string_type(),
            FieldDescriptor::CppStringType::kString);
  EXPECT_EQ(message->FindFieldByName("cord")->cpp_string_type(),
            FieldDescriptor::CppStringType::kCord);

  // Check round-trip consistency.
  FileDescriptorProto proto;
  file->CopyTo(&proto);
  std::string file_textproto;
  google::protobuf::TextFormat::PrintToString(file_proto, &file_textproto);
  EXPECT_THAT(proto, EqualsProto(file_textproto));
}